

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

int http1_on_header(http1_parser_s *parser,char *name,size_t name_len,char *data,size_t data_len)

{
  int *piVar1;
  FIOBJ FVar2;
  uint8_t *puVar3;
  size_t sVar4;
  FIOBJ key;
  FIOBJ obj;
  FIOBJ FVar5;
  FIOBJ ary;
  ulong pos;
  
  FVar2 = parser[3].state.content_length;
  if (FVar2 == 0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (http1 parse ordering error) missing HashMap for header %s: %s",name,
                     data);
    }
    http_send_error2(500,(intptr_t)parser[-1].state.next,
                     *(http_settings_s **)&parser[-1].state.reserved);
  }
  else {
    puVar3 = parser[4].state.next + data_len + name_len;
    parser[4].state.next = puVar3;
    if ((puVar3 < (uint8_t *)parser[4].state.read) &&
       (sVar4 = fiobj_hash_count(FVar2), sVar4 < 0x81)) {
      key = fiobj_str_new(name,name_len);
      obj = fiobj_str_new(data,data_len);
      FVar2 = parser[3].state.content_length;
      FVar5 = fiobj_hash_replace(FVar2,key,obj);
      if (FVar5 != 0) {
        if (obj == 0) {
          fiobj_free(FVar5);
        }
        else {
          if (((~(uint)FVar5 & 6) == 0 || (FVar5 & 1) != 0) ||
             (ary = FVar5, *(char *)(FVar5 & 0xfffffffffffffff8) != ')')) {
            ary = fiobj_ary_new();
            fiobj_ary_push(ary,FVar5);
          }
          if (((~(uint)obj & 6) == 0 || (obj & 1) != 0) ||
             (*(char *)(obj & 0xfffffffffffffff8) != ')')) {
            fiobj_ary_push(ary,obj);
            fiobj_hash_replace(FVar2,key,ary);
          }
          else {
            sVar4 = fiobj_ary_count(obj);
            if (sVar4 != 0) {
              pos = 0;
              do {
                FVar5 = fiobj_ary_index(obj,pos);
                if ((((~(uint)FVar5 & 6) != 0) && (FVar5 != 0)) && ((FVar5 & 1) == 0)) {
                  LOCK();
                  piVar1 = (int *)((FVar5 & 0xfffffffffffffff8) + 4);
                  *piVar1 = *piVar1 + 1;
                  UNLOCK();
                }
                fiobj_ary_push(ary,FVar5);
                pos = pos + 1;
                sVar4 = fiobj_ary_count(obj);
              } while (pos < sVar4);
            }
            fiobj_hash_set(FVar2,key,ary);
          }
        }
      }
      fiobj_free(key);
      return 0;
    }
    if ((*(char *)(*(long *)&parser[-1].state.reserved + 0x7a) != '\0') && (2 < FIO_LOG_LEVEL)) {
      FIO_LOG2STDERR("WARNING: (HTTP) security alert - header flood detected.");
    }
    http_send_error((http_s *)(parser + 1),0x19d);
  }
  return -1;
}

Assistant:

static int http1_on_header(http1_parser_s *parser, char *name, size_t name_len,
                           char *data, size_t data_len) {
  FIOBJ sym;
  FIOBJ obj;
  if (!http1_pr2handle(parser2http(parser)).headers) {
    FIO_LOG_ERROR("(http1 parse ordering error) missing HashMap for header "
                  "%s: %s",
                  name, data);
    http_send_error2(500, parser2http(parser)->p.uuid,
                     parser2http(parser)->p.settings);
    return -1;
  }
  parser2http(parser)->header_size += name_len + data_len;
  if (parser2http(parser)->header_size >=
          parser2http(parser)->max_header_size ||
      fiobj_hash_count(http1_pr2handle(parser2http(parser)).headers) >
          HTTP_MAX_HEADER_COUNT) {
    if (parser2http(parser)->p.settings->log) {
      FIO_LOG_WARNING("(HTTP) security alert - header flood detected.");
    }
    http_send_error(&http1_pr2handle(parser2http(parser)), 413);
    return -1;
  }
  sym = fiobj_str_new(name, name_len);
  obj = fiobj_str_new(data, data_len);
  set_header_add(http1_pr2handle(parser2http(parser)).headers, sym, obj);
  fiobj_free(sym);
  return 0;
}